

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool (anonymous_namespace)::
     TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmProjectDirectoryListGenerator&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>
               (anon_class_8_1_8991fb9c *filesCollector,string *startPath,
               cmProjectDirectoryListGenerator *gen,cmCaseInsensitiveDirectoryListGenerator *tail)

{
  bool bVar1;
  string path;
  string local_70;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&(gen->super_cmDirectoryListGenerator).Matches,
                    (gen->super_cmDirectoryListGenerator).Matches.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (gen->super_cmDirectoryListGenerator).Current._M_current =
       (gen->super_cmDirectoryListGenerator).Matches.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  anon_unknown.dwarf_5ef40b::cmDirectoryListGenerator::GetNextCandidate
            (&local_70,&gen->super_cmDirectoryListGenerator,startPath);
  if (local_70._M_string_length == 0) {
    bVar1 = false;
  }
  else {
    do {
      tail->Loaded = false;
      bVar1 = TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>
                        (filesCollector,&local_70,tail);
      if (bVar1) break;
      anon_unknown.dwarf_5ef40b::cmDirectoryListGenerator::GetNextCandidate
                (&local_50,&gen->super_cmDirectoryListGenerator,startPath);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    } while (local_70._M_string_length != 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool TryGeneratedPaths(CallbackFn&& filesCollector,
                       const std::string& startPath, Generator&& gen,
                       Rest&&... tail)
{
  ResetGenerator(std::forward<Generator&&>(gen));
  for (auto path = gen.GetNextCandidate(startPath); !path.empty();
       path = gen.GetNextCandidate(startPath)) {
    ResetGenerator(std::forward<Rest&&>(tail)...);
    if (TryGeneratedPaths(std::forward<CallbackFn&&>(filesCollector), path,
                          std::forward<Rest&&>(tail)...)) {
      return true;
    }
  }
  return false;
}